

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O1

float __thiscall
logloss::getUpdate(logloss *this,float prediction,float label,float update_scale,
                  float pred_per_update)

{
  double dVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double __x;
  
  fVar2 = expf(prediction * label);
  if (1e-06 <= update_scale * pred_per_update) {
    fVar2 = update_scale * pred_per_update + prediction * label + fVar2;
    dVar1 = (double)fVar2;
    if (fVar2 < 1.0) {
      __x = exp(dVar1 * 0.8 + -0.65);
      dVar3 = dVar1 * 0.2 + 0.65;
    }
    else {
      __x = dVar1 * 0.86 + 0.01;
      dVar3 = log(__x);
      dVar3 = dVar1 - dVar3;
    }
    dVar3 = dVar3 - __x;
    dVar4 = __x + 1.0;
    dVar5 = ((dVar3 + dVar3) / 3.0 + dVar4) * (dVar4 + dVar4);
    fVar2 = -(label * (float)((((dVar3 / dVar4) * (dVar5 - dVar3)) / (dVar5 - (dVar3 + dVar3)) + 1.0
                              ) * __x - dVar1) + prediction) / pred_per_update;
  }
  else {
    fVar2 = (label * update_scale) / (fVar2 + 1.0);
  }
  return fVar2;
}

Assistant:

float getUpdate(float prediction, float label, float update_scale, float pred_per_update)
  {
    float w, x;
    float d = correctedExp(label * prediction);
    if (update_scale * pred_per_update < 1e-6)
    {
      /* As with squared loss, for small eta_t we replace the update
       * with its first order Taylor expansion to avoid numerical problems
       */
      return label * update_scale / (1 + d);
    }
    x = update_scale * pred_per_update + label * prediction + d;
    w = wexpmx(x);
    return -(label * w + prediction) / pred_per_update;
  }